

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::MallocMessageBuilder::allocateSegment(MallocMessageBuilder *this,uint minimumSize)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  ArrayPtr<capnp::word> AVar5;
  int local_78;
  Fault local_60;
  Fault f_2;
  void *result;
  uint size;
  Fault f_1;
  Fault local_30;
  Fault f;
  uint minimumSize_local;
  MallocMessageBuilder *this_local;
  ArrayPtr<capnp::word> result_1;
  
  f.exception._4_4_ = minimumSize;
  uVar1 = bounded<unsigned_int>(minimumSize);
  if (0x1fffffff < uVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xed,FAILED,"bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder asked to allocate segment above maximum serializable size.\""
               ,(char (*) [80])
                "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
    kj::_::Debug::Fault::fatal(&local_30);
  }
  uVar1 = bounded<unsigned_int>(*(uint *)&(this->super_MessageBuilder).field_0xbc);
  if (0x1fffffff < uVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              ((Fault *)&stack0xffffffffffffffb8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
               ,0xef,FAILED,"bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS",
               "\"MallocMessageBuilder nextSize out of bounds.\"",
               (char (*) [45])"MallocMessageBuilder nextSize out of bounds.");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffb8);
  }
  if (((this->returnedFirstSegment & 1U) == 0) && ((this->ownFirstSegment & 1U) == 0)) {
    _this_local = kj::arrayPtr<capnp::word>
                            ((word *)this->firstSegment,
                             (ulong)*(uint *)&(this->super_MessageBuilder).field_0xbc);
    sVar2 = kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
    if (f.exception._4_4_ <= sVar2) {
      this->returnedFirstSegment = true;
      return _this_local;
    }
    this->ownFirstSegment = true;
  }
  result._4_4_ = kj::max<unsigned_int&,unsigned_int&>
                           ((uint *)((long)&f.exception + 4),
                            (uint *)&(this->super_MessageBuilder).field_0xbc);
  f_2.exception = (Exception *)calloc((ulong)result._4_4_,8);
  if (f_2.exception != (Exception *)0x0) {
    if ((this->returnedFirstSegment & 1U) == 0) {
      this->firstSegment = f_2.exception;
      this->returnedFirstSegment = true;
      if (this->allocationStrategy == GROW_HEURISTICALLY) {
        *(WiderType<Decay<unsigned_int_&>,_Decay<unsigned_int_&>_> *)
         &(this->super_MessageBuilder).field_0xbc = result._4_4_;
      }
    }
    else {
      kj::Vector<void*>::add<void*&>((Vector<void*> *)&this->moreSegments,&f_2.exception);
      if (this->allocationStrategy == GROW_HEURISTICALLY) {
        uVar3 = (ulong)result._4_4_;
        uVar4 = unbound<unsigned_long_long>(0x1fffffff);
        if (uVar4 - *(uint *)&(this->super_MessageBuilder).field_0xbc < uVar3) {
          uVar4 = unbound<unsigned_long_long>(0x1fffffff);
          local_78 = (int)uVar4;
        }
        else {
          local_78 = *(int *)&(this->super_MessageBuilder).field_0xbc + result._4_4_;
        }
        *(int *)&(this->super_MessageBuilder).field_0xbc = local_78;
      }
    }
    AVar5 = kj::arrayPtr<capnp::word>((word *)f_2.exception,(ulong)result._4_4_);
    return AVar5;
  }
  kj::_::Debug::Fault::Fault<int,unsigned_int&>
            (&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message.c++"
             ,0x101,0xc,"calloc(size, sizeof(word))","size",(uint *)((long)&result + 4));
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

kj::ArrayPtr<word> MallocMessageBuilder::allocateSegment(uint minimumSize) {
  KJ_REQUIRE(bounded(minimumSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder asked to allocate segment above maximum serializable size.");
  KJ_ASSERT(bounded(nextSize) * WORDS <= MAX_SEGMENT_WORDS,
      "MallocMessageBuilder nextSize out of bounds.");

  if (!returnedFirstSegment && !ownFirstSegment) {
    kj::ArrayPtr<word> result = kj::arrayPtr(reinterpret_cast<word*>(firstSegment), nextSize);
    if (result.size() >= minimumSize) {
      returnedFirstSegment = true;
      return result;
    }
    // If the provided first segment wasn't big enough, we discard it and proceed to allocate
    // our own.  This never happens in practice since minimumSize is always 1 for the first
    // segment.
    ownFirstSegment = true;
  }

  uint size = kj::max(minimumSize, nextSize);

  void* result = calloc(size, sizeof(word));
  if (result == nullptr) {
    KJ_FAIL_SYSCALL("calloc(size, sizeof(word))", ENOMEM, size);
  }

  if (!returnedFirstSegment) {
    firstSegment = result;
    returnedFirstSegment = true;

    // After the first segment, we want nextSize to equal the total size allocated so far.
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) nextSize = size;
  } else {
    moreSegments.add(result);
    if (allocationStrategy == AllocationStrategy::GROW_HEURISTICALLY) {
      // set nextSize = min(nextSize+size, MAX_SEGMENT_WORDS)
      // while protecting against possible overflow of (nextSize+size)
      nextSize = (size <= unbound(MAX_SEGMENT_WORDS / WORDS) - nextSize)
          ? nextSize + size : unbound(MAX_SEGMENT_WORDS / WORDS);
    }
  }

  return kj::arrayPtr(reinterpret_cast<word*>(result), size);
}